

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_sequencetask.cc
# Opt level: O1

void ArgmaxTask::initialize(search *sch,size_t *param_2,options_i *options)

{
  float *location;
  typed_option<float> *ptVar1;
  option_group_definition *poVar2;
  uint uVar3;
  option_group_definition new_options;
  string local_508;
  undefined1 *local_4e8 [2];
  undefined1 local_4d8 [16];
  string local_4c8;
  string local_4a8;
  option_group_definition local_488;
  undefined1 *local_450 [2];
  undefined1 local_440 [16];
  undefined1 *local_430 [2];
  undefined1 local_420 [16];
  undefined1 *local_410;
  long local_408;
  undefined1 local_400 [16];
  undefined1 local_3f0 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_368;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_358;
  typed_option<bool> local_350;
  typed_option<float> local_2b0;
  typed_option<float> local_210;
  typed_option<float> local_170;
  typed_option<float> local_d0;
  
  location = (float *)operator_new(0xc);
  location[0] = 0.0;
  location[1] = 0.0;
  location[2] = 0.0;
  local_410 = local_400;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_410,"argmax options","");
  local_488.m_name._M_dataplus._M_p = (pointer)&local_488.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_488,local_410,local_410 + local_408);
  local_488.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_488.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_488.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_410 != local_400) {
    operator_delete(local_410);
  }
  local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a8,"cost","");
  VW::config::typed_option<float>::typed_option(&local_170,&local_4a8,location);
  ptVar1 = VW::config::typed_option<float>::default_value(&local_170,10.0);
  local_430[0] = local_420;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_430,"False Negative Cost","");
  std::__cxx11::string::_M_assign((string *)&(ptVar1->super_base_option).m_help);
  VW::config::typed_option<float>::typed_option(&local_d0,ptVar1);
  poVar2 = VW::config::option_group_definition::add<float>(&local_488,&local_d0);
  local_4c8._M_dataplus._M_p = (pointer)&local_4c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4c8,"negative_weight","");
  VW::config::typed_option<float>::typed_option(&local_2b0,&local_4c8,location + 1);
  ptVar1 = VW::config::typed_option<float>::default_value(&local_2b0,1.0);
  local_4e8[0] = local_4d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_4e8,"Relative weight of negative examples","");
  std::__cxx11::string::_M_assign((string *)&(ptVar1->super_base_option).m_help);
  VW::config::typed_option<float>::typed_option(&local_210,ptVar1);
  poVar2 = VW::config::option_group_definition::add<float>(poVar2,&local_210);
  local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_508,"max","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_3f0,&local_508,(bool *)(location + 2));
  local_450[0] = local_440;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_450,"Disable structure: just predict the max","");
  std::__cxx11::string::_M_assign((string *)(local_3f0 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_350,(typed_option<bool> *)local_3f0);
  VW::config::option_group_definition::add<bool>(poVar2,&local_350);
  local_350.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cafb0;
  if (local_350.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_350.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_350.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_350.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_350.super_base_option);
  if (local_450[0] != local_440) {
    operator_delete(local_450[0]);
  }
  local_3f0._0_8_ = &PTR__typed_option_002cafb0;
  if (local_358._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_358._M_pi);
  }
  if (local_368._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_368._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_3f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_508._M_dataplus._M_p != &local_508.field_2) {
    operator_delete(local_508._M_dataplus._M_p);
  }
  local_210.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cb0f8;
  if (local_210.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_210.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_210.super_base_option);
  if (local_4e8[0] != local_4d8) {
    operator_delete(local_4e8[0]);
  }
  local_2b0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cb0f8;
  if (local_2b0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_2b0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_2b0.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
    operator_delete(local_4c8._M_dataplus._M_p);
  }
  local_d0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cb0f8;
  if (local_d0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_d0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_d0.super_base_option);
  if (local_430[0] != local_420) {
    operator_delete(local_430[0]);
  }
  local_170.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cb0f8;
  if (local_170.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_170.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_170.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
    operator_delete(local_4a8._M_dataplus._M_p);
  }
  (**options->_vptr_options_i)(options);
  sch->task_data = location;
  uVar3 = 0;
  if (*(char *)(location + 2) == '\0') {
    uVar3 = Search::AUTO_CONDITION_FEATURES;
  }
  Search::search::set_options(sch,uVar3 | Search::EXAMPLES_DONT_CHANGE);
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_488.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_488.m_name._M_dataplus._M_p != &local_488.m_name.field_2) {
    operator_delete(local_488.m_name._M_dataplus._M_p);
  }
  return;
}

Assistant:

void initialize(Search::search& sch, size_t& /*num_actions*/, options_i& options)
{
  task_data* D = new task_data();

  option_group_definition new_options("argmax options");
  new_options.add(make_option("cost", D->false_negative_cost).default_value(10.0f).help("False Negative Cost"))
      .add(make_option("negative_weight", D->negative_weight)
               .default_value(1.f)
               .help("Relative weight of negative examples"))
      .add(make_option("max", D->predict_max).help("Disable structure: just predict the max"));
  options.add_and_parse(new_options);

  sch.set_task_data(D);

  if (D->predict_max)
    sch.set_options(Search::EXAMPLES_DONT_CHANGE);  // we don't do any internal example munging
  else
    sch.set_options(Search::AUTO_CONDITION_FEATURES |  // automatically add history features to our examples, please
        Search::EXAMPLES_DONT_CHANGE);                 // we don't do any internal example munging
}